

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateSettingsResourcePrefsFile(cmExtraEclipseCDT4Generator *this)

{
  cmMakefile *this_00;
  cmValue cVar1;
  ostream *poVar2;
  allocator<char> local_2b9;
  string local_2b8;
  string filename;
  cmGeneratedFileStream fout;
  
  this_00 = *(cmMakefile **)
             ((long)(((((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
                      LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t + 0x70);
  std::operator+(&filename,&this->HomeOutputDirectory,"/.settings/org.eclipse.core.resources.prefs")
  ;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::operator<<((ostream *)&fout,"eclipse.preferences.version=1\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"CMAKE_ECLIPSE_RESOURCE_ENCODING",&local_2b9);
    cVar1 = cmMakefile::GetDefinition(this_00,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    if (cVar1.Value != (string *)0x0) {
      poVar2 = std::operator<<((ostream *)&fout,"encoding/<project>=");
      poVar2 = std::operator<<(poVar2,(string *)cVar1.Value);
      std::operator<<(poVar2,'\n');
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSettingsResourcePrefsFile()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename =
    this->HomeOutputDirectory + "/.settings/org.eclipse.core.resources.prefs";

  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "eclipse.preferences.version=1\n";
  cmValue encoding = mf->GetDefinition("CMAKE_ECLIPSE_RESOURCE_ENCODING");
  if (encoding) {
    fout << "encoding/<project>=" << *encoding << '\n';
  }
}